

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::passModel(Highs *this,HighsInt num_col,HighsInt num_row,HighsInt a_num_nz,HighsInt q_num_nz,
                HighsInt a_format,HighsInt q_format,HighsInt sense,double offset,double *costs,
                double *col_lower,double *col_upper,double *row_lower,double *row_upper,
                HighsInt *a_start,HighsInt *a_index,double *a_value,HighsInt *q_start,
                HighsInt *q_index,double *q_value,HighsInt *integrality)

{
  uint uVar1;
  bool bVar2;
  HighsInt HVar3;
  HighsStatus HVar4;
  char *format;
  MatrixFormat MVar5;
  ulong uVar6;
  ulong __new_size;
  undefined1 local_800 [32];
  vector<double,std::allocator<double>> local_7e0 [24];
  vector<double,std::allocator<double>> local_7c8 [24];
  vector<double,std::allocator<double>> local_7b0 [24];
  vector<double,std::allocator<double>> local_798 [24];
  MatrixFormat local_780;
  vector<int,_std::allocator<int>_> local_770 [2];
  vector<int,std::allocator<int>> local_740 [24];
  vector<double,std::allocator<double>> local_728 [24];
  ObjSense local_710;
  double local_708;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_688 [22];
  undefined1 local_468 [8];
  pointer local_460;
  pointer piStack_458;
  pointer local_450;
  pointer local_448;
  pointer piStack_440;
  pointer local_438;
  pointer local_430;
  pointer pdStack_428;
  pointer local_420;
  HighsModel local_418;
  
  if ((this->written_log_header_ == false) &&
     (*(this->options_).super_HighsOptionsStruct.log_options.output_flag == true)) {
    highsLogHeader(&(this->options_).super_HighsOptionsStruct.log_options,
                   (this->options_).super_HighsOptionsStruct.log_githash);
    this->written_log_header_ = true;
  }
  HighsLp::HighsLp((HighsLp *)local_800);
  HighsHessian::HighsHessian((HighsHessian *)local_468);
  bVar2 = aFormatOk(this,a_num_nz,a_format);
  if (bVar2) {
    bVar2 = qFormatOk(this,q_num_nz,q_format);
    if (bVar2) {
      __new_size = (ulong)(uint)num_col;
      local_800._0_4_ = num_col;
      local_800._4_4_ = num_row;
      if (0 < num_col) {
        std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
                  ((vector<double,std::allocator<double>> *)(local_800 + 8),costs,costs + __new_size
                  );
        std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
                  (local_7e0,col_lower,col_lower + __new_size);
        std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
                  (local_7c8,col_upper,col_upper + __new_size);
      }
      if (0 < num_row) {
        std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
                  (local_7b0,row_lower,row_lower + (uint)num_row);
        std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
                  (local_798,row_upper,row_upper + (uint)num_row);
      }
      if (0 < a_num_nz) {
        HVar3 = num_col;
        if (a_format == 2) {
          HVar3 = num_row;
        }
        std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                  ((vector<int,std::allocator<int>> *)local_770,a_start,a_start + HVar3);
        std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                  (local_740,a_index,a_index + (uint)a_num_nz);
        std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
                  (local_728,a_value,a_value + (uint)a_num_nz);
      }
      if (a_num_nz < 1 || a_format != 2) {
        MVar5 = kColwise;
        std::vector<int,_std::allocator<int>_>::resize(local_770,(long)(num_col + 1));
        num_row = num_col;
      }
      else {
        MVar5 = kRowwise;
        std::vector<int,_std::allocator<int>_>::resize(local_770,(long)(num_row + 1));
      }
      local_770[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[num_row] = a_num_nz;
      local_710 = ((sense != -1) - 1) + (uint)(sense != -1);
      local_780 = MVar5;
      local_708 = offset;
      if (integrality != (HighsInt *)0x0 && 0 < num_col) {
        std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize(local_688,__new_size);
        uVar6 = 0;
        do {
          uVar1 = integrality[uVar6];
          if (3 < uVar1) {
            highsLogDev(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                        "Model has illegal integer value of %d for integrality[%d]\n",(ulong)uVar1,
                        uVar6 & 0xffffffff);
            HVar4 = kError;
            goto LAB_00209a9f;
          }
          local_688[0].super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] = (HighsVarType)uVar1;
          uVar6 = uVar6 + 1;
        } while (__new_size != uVar6);
      }
      if (0 < q_num_nz) {
        local_468._4_4_ = kTriangular;
        local_468._0_4_ = num_col;
        std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                  ((vector<int,std::allocator<int>> *)&local_460,q_start,q_start + num_col);
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)&local_460,(long)(num_col + 1));
        local_460[num_col] = q_num_nz;
        std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                  ((vector<int,std::allocator<int>> *)&local_448,q_index,q_index + (uint)q_num_nz);
        std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
                  ((vector<double,std::allocator<double>> *)&local_430,q_value,
                   q_value + (uint)q_num_nz);
      }
      HighsLp::HighsLp(&local_418.lp_,(HighsLp *)local_800);
      local_418.hessian_.format_ = local_468._4_4_;
      local_418.hessian_.dim_ = local_468._0_4_;
      local_418.hessian_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = local_460;
      local_418.hessian_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piStack_458;
      local_418.hessian_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_450;
      local_460 = (pointer)0x0;
      piStack_458 = (pointer)0x0;
      local_450 = (pointer)0x0;
      local_418.hessian_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = local_448;
      local_418.hessian_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piStack_440;
      local_418.hessian_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_438;
      local_448 = (pointer)0x0;
      piStack_440 = (pointer)0x0;
      local_438 = (pointer)0x0;
      local_418.hessian_.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = local_430;
      local_418.hessian_.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdStack_428;
      local_418.hessian_.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_420;
      local_430 = (pointer)0x0;
      pdStack_428 = (pointer)0x0;
      local_420 = (pointer)0x0;
      HVar4 = passModel(this,&local_418);
      if (local_418.hessian_.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_418.hessian_.value_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_418.hessian_.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_418.hessian_.index_.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_418.hessian_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_418.hessian_.start_.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      HighsLp::~HighsLp(&local_418.lp_);
      goto LAB_00209a9f;
    }
    format = "Model has illegal Hessian matrix format\n";
  }
  else {
    format = "Model has illegal constraint matrix format\n";
  }
  HVar4 = kError;
  highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,format);
LAB_00209a9f:
  if (local_430 != (pointer)0x0) {
    operator_delete(local_430);
  }
  if (local_448 != (pointer)0x0) {
    operator_delete(local_448);
  }
  if (local_460 != (pointer)0x0) {
    operator_delete(local_460);
  }
  HighsLp::~HighsLp((HighsLp *)local_800);
  return HVar4;
}

Assistant:

HighsStatus Highs::passModel(
    const HighsInt num_col, const HighsInt num_row, const HighsInt a_num_nz,
    const HighsInt q_num_nz, const HighsInt a_format, const HighsInt q_format,
    const HighsInt sense, const double offset, const double* costs,
    const double* col_lower, const double* col_upper, const double* row_lower,
    const double* row_upper, const HighsInt* a_start, const HighsInt* a_index,
    const double* a_value, const HighsInt* q_start, const HighsInt* q_index,
    const double* q_value, const HighsInt* integrality) {
  this->logHeader();
  HighsModel model;
  HighsLp& lp = model.lp_;
  // Check that the formats of the constraint matrix and Hessian are valid
  if (!aFormatOk(a_num_nz, a_format)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model has illegal constraint matrix format\n");
    return HighsStatus::kError;
  }
  if (!qFormatOk(q_num_nz, q_format)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model has illegal Hessian matrix format\n");
    return HighsStatus::kError;
  }
  const bool a_rowwise =
      a_num_nz > 0 ? a_format == (HighsInt)MatrixFormat::kRowwise : false;
  //  if (num_nz) a_rowwise = a_format == (HighsInt)MatrixFormat::kRowwise;

  lp.num_col_ = num_col;
  lp.num_row_ = num_row;
  if (num_col > 0) {
    assert(costs != NULL);
    assert(col_lower != NULL);
    assert(col_upper != NULL);
    lp.col_cost_.assign(costs, costs + num_col);
    lp.col_lower_.assign(col_lower, col_lower + num_col);
    lp.col_upper_.assign(col_upper, col_upper + num_col);
  }
  if (num_row > 0) {
    assert(row_lower != NULL);
    assert(row_upper != NULL);
    lp.row_lower_.assign(row_lower, row_lower + num_row);
    lp.row_upper_.assign(row_upper, row_upper + num_row);
  }
  if (a_num_nz > 0) {
    assert(num_col > 0);
    assert(num_row > 0);
    assert(a_start != NULL);
    assert(a_index != NULL);
    assert(a_value != NULL);
    if (a_rowwise) {
      lp.a_matrix_.start_.assign(a_start, a_start + num_row);
    } else {
      lp.a_matrix_.start_.assign(a_start, a_start + num_col);
    }
    lp.a_matrix_.index_.assign(a_index, a_index + a_num_nz);
    lp.a_matrix_.value_.assign(a_value, a_value + a_num_nz);
  }
  if (a_rowwise) {
    lp.a_matrix_.start_.resize(num_row + 1);
    lp.a_matrix_.start_[num_row] = a_num_nz;
    lp.a_matrix_.format_ = MatrixFormat::kRowwise;
  } else {
    lp.a_matrix_.start_.resize(num_col + 1);
    lp.a_matrix_.start_[num_col] = a_num_nz;
    lp.a_matrix_.format_ = MatrixFormat::kColwise;
  }
  if (sense == (HighsInt)ObjSense::kMaximize) {
    lp.sense_ = ObjSense::kMaximize;
  } else {
    lp.sense_ = ObjSense::kMinimize;
  }
  lp.offset_ = offset;
  if (num_col > 0 && integrality != NULL) {
    lp.integrality_.resize(num_col);
    for (HighsInt iCol = 0; iCol < num_col; iCol++) {
      HighsInt integrality_status = integrality[iCol];
      const bool legal_integrality_status =
          integrality_status == (HighsInt)HighsVarType::kContinuous ||
          integrality_status == (HighsInt)HighsVarType::kInteger ||
          integrality_status == (HighsInt)HighsVarType::kSemiContinuous ||
          integrality_status == (HighsInt)HighsVarType::kSemiInteger;
      if (!legal_integrality_status) {
        highsLogDev(
            options_.log_options, HighsLogType::kError,
            "Model has illegal integer value of %d for integrality[%d]\n",
            (int)integrality_status, iCol);
        return HighsStatus::kError;
      }
      lp.integrality_[iCol] = (HighsVarType)integrality_status;
    }
  }
  if (q_num_nz > 0) {
    assert(num_col > 0);
    assert(q_start != NULL);
    assert(q_index != NULL);
    assert(q_value != NULL);
    HighsHessian& hessian = model.hessian_;
    hessian.dim_ = num_col;
    hessian.format_ = HessianFormat::kTriangular;
    hessian.start_.assign(q_start, q_start + num_col);
    hessian.start_.resize(num_col + 1);
    hessian.start_[num_col] = q_num_nz;
    hessian.index_.assign(q_index, q_index + q_num_nz);
    hessian.value_.assign(q_value, q_value + q_num_nz);
  }
  return passModel(std::move(model));
}